

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void __thiscall
ByteCodeGenerator::EmitLoadInstance
          (ByteCodeGenerator *this,Symbol *sym,IdentPtr pid,RegSlot *pThisLocation,
          RegSlot *pInstLocation,FuncInfo *funcInfo)

{
  code *pcVar1;
  ByteCodeWriter *this_00;
  bool bVar2;
  ushort uVar3;
  RegSlot RVar4;
  PropertyId PVar5;
  uint uVar6;
  RegSlot RVar7;
  ByteCodeLabel labelID;
  Scope **ppSVar8;
  undefined4 *puVar9;
  Scope *pSVar10;
  Type *pTVar11;
  OpCode OVar12;
  int i;
  DynamicLoadKind DVar13;
  int index;
  undefined1 local_c8 [8];
  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  recList;
  undefined1 local_68 [8];
  DynamicLoadRecord rec;
  PropertyId local_50;
  RegSlot local_4c;
  PropertyId envIndex;
  ByteCodeWriter *local_40;
  RegSlot local_34;
  
  RVar4 = *pThisLocation;
  local_34 = *pInstLocation;
  local_50 = -1;
  recList._40_8_ = &this->globalScope;
  ppSVar8 = &sym->scope;
  if (sym == (Symbol *)0x0) {
    ppSVar8 = (Scope **)recList._40_8_;
  }
  pSVar10 = *ppSVar8;
  if (pSVar10 == (Scope *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1073,"(symScope)","symScope");
    if (!bVar2) goto LAB_00765242;
    *puVar9 = 0;
  }
  if ((sym != (Symbol *)0x0) && ((sym->field_0x43 & 0x40) != 0)) {
    *pInstLocation = 0xffffffff;
    return;
  }
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>._16_8_ =
       this->alloc;
  local_c8 = (undefined1  [8])&PTR_IsReadOnly_0137a130;
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
  _vptr_ReadOnlyList = (_func_int **)0x0;
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.buffer.
  _0_4_ = 0;
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.alloc =
       (Type)0x400000000;
  unique0x10000913 = pSVar10;
  local_4c = RVar4;
  _envIndex = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  local_40 = &this->m_writer;
  rec.label = -1;
  pSVar10 = (Scope *)0x0;
  RVar4 = local_34;
  while (pSVar10 = FindScopeForSym(this,stack0xffffffffffffffa8,pSVar10,&local_50,funcInfo),
        pSVar10 != *(Scope **)recList._40_8_) {
    if (RVar4 == 0xffffffff && pSVar10 != stack0xffffffffffffffa8) {
      RVar4 = FuncInfo::AcquireTmpRegister(funcInfo);
    }
    if (local_50 == -1) {
      if (pSVar10->func != funcInfo) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *_envIndex = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x1094,"(funcInfo == scope->GetFunc())","funcInfo == scope->GetFunc()");
        if (!bVar2) goto LAB_00765242;
        *_envIndex = 0;
      }
      rec.label = pSVar10->location;
    }
    if (pSVar10 == stack0xffffffffffffffa8) break;
    if ((pSVar10 == (Scope *)0x0) || (uVar3 = *(ushort *)&pSVar10->field_0x44, (uVar3 & 1) == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *_envIndex = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x109e,"(scope && scope->GetIsDynamic())","scope && scope->GetIsDynamic()"
                        );
      if (!bVar2) goto LAB_00765242;
      *_envIndex = 0;
      uVar3 = *(ushort *)&pSVar10->field_0x44;
    }
    if ((uVar3 & 2) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *_envIndex = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x109f,"(scope->GetIsObject())","scope->GetIsObject()");
      if (!bVar2) goto LAB_00765242;
      *_envIndex = 0;
    }
    DynamicLoadRecord::DynamicLoadRecord((DynamicLoadRecord *)local_68);
    local_68._4_4_ = Js::ByteCodeWriter::DefineLabel(local_40);
    if (sym == (Symbol *)0x0) {
      PVar5 = pid->m_propertyId;
    }
    else {
      PVar5 = Symbol::EnsurePosition(sym,this);
    }
    uVar6 = FuncInfo::FindOrAddReferencedPropertyId(funcInfo,PVar5);
    if (pSVar10->scopeType == ScopeType_With) {
      if (local_4c == 0xffffffff) {
        local_4c = FuncInfo::AcquireTmpRegister(funcInfo);
      }
      if (local_50 == -1) {
        Js::ByteCodeWriter::BrProperty(local_40,BrOnHasProperty,local_68._4_4_,rec.label,uVar6);
        local_68._0_4_ = LocalWith;
        rec.kind = rec.label;
      }
      else {
        DVar13 = local_50 + Local;
        Js::ByteCodeWriter::BrEnvProperty(local_40,BrOnHasEnvProperty,local_68._4_4_,uVar6,DVar13);
        local_68._0_4_ = EnvWith;
        rec.kind = DVar13;
      }
    }
    else if (local_50 == -1) {
      Js::ByteCodeWriter::BrLocalProperty(local_40,BrOnHasLocalProperty,local_68._4_4_,uVar6);
      local_68._0_4_ = Local;
    }
    else {
      DVar13 = local_50 + Local;
      Js::ByteCodeWriter::BrEnvProperty
                (local_40,BrOnHasLocalEnvProperty,local_68._4_4_,uVar6,DVar13);
      local_68._0_4_ = Env;
      rec.kind = DVar13;
    }
    JsUtil::
    List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
    Add((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
         *)local_c8,(DynamicLoadRecord *)local_68);
  }
  RVar7 = local_4c;
  if ((sym == (Symbol *)0x0) || ((sym->field_0x42 & 8) != 0)) {
    if ((this->flags & 0x404) == 0) {
      if (RVar4 == 0xffffffff) {
        local_34 = 0xfffffffd;
      }
      else {
        local_34 = RVar4;
        Js::ByteCodeWriter::Reg2(local_40,Ld_A,RVar4,0xfffffffd);
      }
      RVar4 = funcInfo->undefinedConstantRegister;
      if (RVar7 != 0xffffffff) {
        Js::ByteCodeWriter::Reg2(local_40,Ld_A,RVar7,RVar4);
        RVar4 = RVar7;
      }
    }
    else {
      local_34 = RVar4;
      if (RVar4 == 0xffffffff) {
        local_34 = FuncInfo::AcquireTmpRegister(funcInfo);
      }
      if (sym == (Symbol *)0x0) {
        PVar5 = pid->m_propertyId;
      }
      else {
        PVar5 = Symbol::EnsurePosition(sym,this);
      }
      if (RVar7 == 0xffffffff) {
        RVar7 = FuncInfo::AcquireTmpRegister(funcInfo);
      }
      uVar6 = FuncInfo::FindOrAddReferencedPropertyId(funcInfo,PVar5);
      Js::ByteCodeWriter::ScopedProperty2(local_40,ScopedLdInst,local_34,uVar6,RVar7);
      RVar4 = RVar7;
    }
LAB_00764ee6:
    if ((int)recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
             buffer == 0) {
LAB_00765211:
      *pThisLocation = RVar4;
      *pInstLocation = local_34;
      JsUtil::
      List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::~List((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               *)local_c8);
      return;
    }
    if (local_34 == 0xffffffff) goto LAB_00764ef9;
  }
  else {
    if (RVar4 != 0xffffffff) {
      if (local_50 == -1) {
        if (pSVar10->innerScopeIndex == 0xffffffff) {
          if (stack0xffffffffffffffa8 == funcInfo->paramScope) {
            if ((funcInfo->frameObjRegister == 0xffffffff) ||
               (OVar12 = LdParamObj, local_34 = RVar4, (funcInfo->field_0xb5 & 0x80) != 0)) {
              AssertCount = AssertCount + 1;
              local_34 = RVar4;
              Js::Throw::LogAssert();
              *_envIndex = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                                 ,0x1117,
                                 "(funcInfo->frameObjRegister != Js::Constants::NoRegister && !funcInfo->IsBodyAndParamScopeMerged())"
                                 ,
                                 "funcInfo->frameObjRegister != Js::Constants::NoRegister && !funcInfo->IsBodyAndParamScopeMerged()"
                                );
              OVar12 = LdParamObj;
LAB_00764ea9:
              if (bVar2 == false) goto LAB_00765242;
              *_envIndex = 0;
            }
          }
          else {
            if (stack0xffffffffffffffa8 != funcInfo->bodyScope) {
              local_34 = RVar4;
              Js::ByteCodeWriter::Reg2(local_40,Ld_A,RVar4,rec.label);
              goto LAB_00764ec7;
            }
            OVar12 = LdLocalObj;
            local_34 = RVar4;
            if (funcInfo->frameObjRegister == 0xffffffff) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *_envIndex = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                                 ,0x1120,"(funcInfo->frameObjRegister != Js::Constants::NoRegister)"
                                 ,"funcInfo->frameObjRegister != Js::Constants::NoRegister");
              OVar12 = LdLocalObj;
              goto LAB_00764ea9;
            }
          }
          Js::ByteCodeWriter::Reg1(local_40,OVar12,local_34);
        }
        else {
          local_34 = RVar4;
          Js::ByteCodeWriter::Reg1Unsigned1(local_40,LdInnerScope,RVar4,pSVar10->innerScopeIndex);
          RVar7 = local_4c;
        }
      }
      else {
        local_34 = RVar4;
        if ((pSVar10->field_0x44 & 2) == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *_envIndex = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x110d,"(scope->GetIsObject())","scope->GetIsObject()");
          if (!bVar2) goto LAB_00765242;
          *_envIndex = 0;
        }
        Js::ByteCodeWriter::SlotI1(local_40,LdEnvObj,local_34,local_50 + 1);
      }
LAB_00764ec7:
      RVar4 = funcInfo->undefinedConstantRegister;
      if (RVar7 != 0xffffffff) {
        Js::ByteCodeWriter::Reg2(local_40,Ld_A,RVar7,RVar4);
        RVar4 = RVar7;
      }
      goto LAB_00764ee6;
    }
    RVar4 = local_4c;
    if ((int)recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
             buffer == 0) {
      local_34 = 0xffffffff;
      goto LAB_00765211;
    }
LAB_00764ef9:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *_envIndex = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1130,"(instLocation != Js::Constants::NoRegister)",
                       "instLocation != Js::Constants::NoRegister");
    if (!bVar2) goto LAB_00765242;
    *_envIndex = 0;
    local_34 = 0xffffffff;
  }
  if (RVar4 == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *_envIndex = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1131,"(thisLocation != Js::Constants::NoRegister)",
                       "thisLocation != Js::Constants::NoRegister");
    if (!bVar2) {
LAB_00765242:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *_envIndex = 0;
  }
  this_00 = local_40;
  labelID = Js::ByteCodeWriter::DefineLabel(local_40);
  Js::ByteCodeWriter::Br(this_00,labelID);
  unique0x00004e80 = (Scope *)&funcInfo->undefinedConstantRegister;
  index = 0;
  do {
    pTVar11 = JsUtil::
              List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                      *)local_c8,index);
    Js::ByteCodeWriter::MarkLabel(local_40,pTVar11->label);
    pTVar11 = JsUtil::
              List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                      *)local_c8,index);
    switch(pTVar11->kind) {
    case Local:
      Js::ByteCodeWriter::Reg1(local_40,LdLocalObj_ReuseLoc,local_34);
      RVar7 = *(RegSlot *)&stack0xffffffffffffffa8->enclosingScope;
      if (RVar4 != RVar7) {
        OVar12 = Ld_A_ReuseLoc;
        if (RVar4 != local_34) goto LAB_00765191;
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *_envIndex = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x113f,"(thisLocation != instLocation)","thisLocation != instLocation");
LAB_00765176:
        if (bVar2 != false) {
          *_envIndex = 0;
          OVar12 = Ld_A_ReuseLoc;
          pSVar10 = stack0xffffffffffffffa8;
          goto LAB_0076518d;
        }
        goto LAB_00765242;
      }
      break;
    case Env:
      pTVar11 = JsUtil::
                List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                        *)local_c8,index);
      Js::ByteCodeWriter::SlotI1(local_40,LdEnvObj_ReuseLoc,local_34,(pTVar11->field_2).index);
      RVar7 = *(RegSlot *)&stack0xffffffffffffffa8->enclosingScope;
      if (RVar4 != RVar7) {
        OVar12 = Ld_A_ReuseLoc;
        if (RVar4 == local_34) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *_envIndex = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x1148,"(thisLocation != instLocation)","thisLocation != instLocation"
                            );
          goto LAB_00765176;
        }
        goto LAB_00765191;
      }
      break;
    case LocalWith:
      pTVar11 = JsUtil::
                List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                        *)local_c8,index);
      Js::ByteCodeWriter::Reg2(local_40,UnwrapWithObj_ReuseLoc,local_34,(pTVar11->field_2).instance)
      ;
      pTVar11 = JsUtil::
                List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                        *)local_c8,index);
      OVar12 = UnwrapWithObj_ReuseLoc;
      pSVar10 = (Scope *)&pTVar11->field_2;
LAB_0076518d:
      RVar7 = *(RegSlot *)&pSVar10->enclosingScope;
LAB_00765191:
      Js::ByteCodeWriter::Reg2(local_40,OVar12,RVar4,RVar7);
      break;
    case EnvWith:
      RVar7 = FuncInfo::AcquireTmpRegister(funcInfo);
      pTVar11 = JsUtil::
                List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                        *)local_c8,index);
      Js::ByteCodeWriter::SlotI1(local_40,LdEnvObj,RVar7,(pTVar11->field_2).index);
      Js::ByteCodeWriter::Reg2(local_40,UnwrapWithObj_ReuseLoc,local_34,RVar7);
      Js::ByteCodeWriter::Reg2(local_40,UnwrapWithObj_ReuseLoc,RVar4,RVar7);
      FuncInfo::ReleaseTmpRegister(funcInfo,RVar7);
      break;
    default:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *_envIndex = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x115d,"((0))","(0)");
      if (!bVar2) goto LAB_00765242;
      *_envIndex = 0;
    }
    if (index == (int)recList.
                      super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>
                      .buffer + -1) break;
    Js::ByteCodeWriter::Br(local_40,labelID);
    index = index + 1;
  } while( true );
  Js::ByteCodeWriter::MarkLabel(local_40,labelID);
  goto LAB_00765211;
}

Assistant:

void ByteCodeGenerator::EmitLoadInstance(Symbol *sym, IdentPtr pid, Js::RegSlot *pThisLocation, Js::RegSlot *pInstLocation, FuncInfo *funcInfo)
{
    Js::RegSlot scopeLocation = Js::Constants::NoRegister;
    Js::RegSlot thisLocation = *pThisLocation;
    Js::RegSlot instLocation = *pInstLocation;
    Js::PropertyId envIndex = -1;
    Scope *scope = nullptr;
    Scope *symScope = sym ? sym->GetScope() : this->globalScope;
    Assert(symScope);

    if (sym != nullptr && sym->GetIsModuleExportStorage())
    {
        *pInstLocation = Js::Constants::NoRegister;
        return;
    }

    JsUtil::List<DynamicLoadRecord, ArenaAllocator> recList(this->alloc);

    for (;;)
    {
        scope = this->FindScopeForSym(symScope, scope, &envIndex, funcInfo);
        if (scope == this->globalScope)
        {
            break;
        }

        if (scope != symScope)
        {
            // We're not sure where the function is (eval/with/etc).
            // So we're going to need registers to hold the instance where we (dynamically) find
            // the function, and possibly to hold the "this" pointer we will pass to it.
            // Assign them here so that they can't overlap with the scopeLocation assigned below.
            // Otherwise we wind up with temp lifetime confusion in the IRBuilder. (Win8 281689)
            if (instLocation == Js::Constants::NoRegister)
            {
                instLocation = funcInfo->AcquireTmpRegister();
            }
        }

        if (envIndex == -1)
        {
            Assert(funcInfo == scope->GetFunc());
            scopeLocation = scope->GetLocation();
        }

        if (scope == symScope)
        {
            break;
        }

        // Found a scope to which the property may have been added.
        Assert(scope && scope->GetIsDynamic());
        AssertOrFailFast(scope->GetIsObject());

        // Record dynamic scopes, in order. Define a label for each one. Remember whether we've seen a 'with'.
        // For each dynamic scope, emit BrOnHas[Env,Local]Property $Ln, where n is the scope's position in the list
        // Then emit code for default access (i.e., static binding). If no 'with', do not create a temp for 'this', just use 'undefined'.
        // End static portion with 'Br $Ldone'.
        // Then, for each item in list, emit:
        // $Ln:
        //     copy dynamic scope to 'instance' temp, using 'reuse_loc' form of the opcode
        //     do the same for 'this' temp', only if we've seen a 'with'
        //     if not the last item in the list, Br $Ldone

        DynamicLoadRecord rec;
            
        rec.label = this->m_writer.DefineLabel();
        Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();
        Js::PropertyIdIndexType propertyIndex = funcInfo->FindOrAddReferencedPropertyId(propertyId);

        if (scope->GetScopeType() != ScopeType_With)
        {
            if (envIndex == -1)
            {
                // The local body scope. Branch cannot bail on implicit calls.
              
                this->m_writer.BrLocalProperty(Js::OpCode::BrOnHasLocalProperty, rec.label, propertyIndex);
                rec.kind = DynamicLoadKind::Local;
            }
            else
            {
                // Function body scope in an enclosing function that calls eval.
                // Emit a branch opcode that does not require bail on implicit calls.

                uint32 frameDisplayIndex = envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var);
                this->m_writer.BrEnvProperty(Js::OpCode::BrOnHasLocalEnvProperty, rec.label, propertyIndex, frameDisplayIndex);
                rec.kind = DynamicLoadKind::Env;
                rec.index = frameDisplayIndex;
            }
        }
        else
        {
            if (thisLocation == Js::Constants::NoRegister)
            {
                thisLocation = funcInfo->AcquireTmpRegister();
            }

            if (envIndex == -1)
            {
                // With object declared in this function. HasProperty may have implicit calls.
                this->m_writer.BrProperty(Js::OpCode::BrOnHasProperty, rec.label, scopeLocation, propertyIndex);
                rec.kind = DynamicLoadKind::LocalWith;
                rec.instance = scopeLocation;
            }
            else
            {
                // With object declared in an enclosing function. HasProperty may have implicit calls.
                uint32 frameDisplayIndex = envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var);
                this->m_writer.BrEnvProperty(Js::OpCode::BrOnHasEnvProperty, rec.label, propertyIndex, frameDisplayIndex);
                rec.kind = DynamicLoadKind::EnvWith;
                rec.index = frameDisplayIndex;
            }
        }

        recList.Add(rec);
    }

    if (sym == nullptr || sym->GetIsGlobal())
    {
        if (this->flags & (fscrEval | fscrImplicitThis))
        {
            // Load of a symbol with unknown scope from within eval.
            // Get it from the closure environment.
            if (instLocation == Js::Constants::NoRegister)
            {
                instLocation = funcInfo->AcquireTmpRegister();
            }

            Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();

            if (thisLocation == Js::Constants::NoRegister)
            {
                thisLocation = funcInfo->AcquireTmpRegister();
            }
            this->m_writer.ScopedProperty2(Js::OpCode::ScopedLdInst, instLocation,
                funcInfo->FindOrAddReferencedPropertyId(propertyId), thisLocation);
        }
        else
        {
            if (instLocation == Js::Constants::NoRegister)
            {
                instLocation = ByteCodeGenerator::RootObjectRegister;
            }
            else
            {
                this->m_writer.Reg2(Js::OpCode::Ld_A, instLocation, ByteCodeGenerator::RootObjectRegister);
            }

            if (thisLocation == Js::Constants::NoRegister)
            {
                thisLocation = funcInfo->undefinedConstantRegister;
            }
            else
            {
                this->m_writer.Reg2(Js::OpCode::Ld_A, thisLocation, funcInfo->undefinedConstantRegister);
            }
        }
    }
    else if (instLocation != Js::Constants::NoRegister)
    {
        if (envIndex != -1)
        {
            AssertOrFailFast(scope->GetIsObject());
            this->m_writer.SlotI1(Js::OpCode::LdEnvObj, instLocation,
                envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var));
        }
        else if (scope->HasInnerScopeIndex())
        {
            this->m_writer.Reg1Unsigned1(Js::OpCode::LdInnerScope, instLocation, scope->GetInnerScopeIndex());
        }
        else if (symScope == funcInfo->GetParamScope())
        {
            Assert(funcInfo->frameObjRegister != Js::Constants::NoRegister && !funcInfo->IsBodyAndParamScopeMerged());
            this->m_writer.Reg1(Js::OpCode::LdParamObj, instLocation);
        }
        else if (symScope != funcInfo->GetBodyScope())
        {
            this->m_writer.Reg2(Js::OpCode::Ld_A, instLocation, scopeLocation);
        }
        else
        {
            Assert(funcInfo->frameObjRegister != Js::Constants::NoRegister);
            this->m_writer.Reg1(Js::OpCode::LdLocalObj, instLocation);
        }

        if (thisLocation != Js::Constants::NoRegister)
        {
            this->m_writer.Reg2(Js::OpCode::Ld_A, thisLocation, funcInfo->undefinedConstantRegister);
        }
        else
        {
            thisLocation = funcInfo->undefinedConstantRegister;
        }
    }

    if (!recList.Empty())
    {
        Assert(instLocation != Js::Constants::NoRegister);
        Assert(thisLocation != Js::Constants::NoRegister);

        Js::ByteCodeLabel doneLabel = this->m_writer.DefineLabel();
        this->m_writer.Br(doneLabel);

        for (int i = 0;; i++)
        {
            this->m_writer.MarkLabel(recList.Item(i).label);
            switch(recList.Item(i).kind)
            {
                case DynamicLoadKind::Local:
                    this->m_writer.Reg1(Js::OpCode::LdLocalObj_ReuseLoc, instLocation);
                    if (thisLocation != funcInfo->undefinedConstantRegister)
                    {
                        Assert(thisLocation != instLocation);
                        this->m_writer.Reg2(Js::OpCode::Ld_A_ReuseLoc, thisLocation, funcInfo->undefinedConstantRegister);
                    }
                    break;

                case DynamicLoadKind::Env:
                    this->m_writer.SlotI1(Js::OpCode::LdEnvObj_ReuseLoc, instLocation, recList.Item(i).index);
                    if (thisLocation != funcInfo->undefinedConstantRegister)
                    {
                        Assert(thisLocation != instLocation);
                        this->m_writer.Reg2(Js::OpCode::Ld_A_ReuseLoc, thisLocation, funcInfo->undefinedConstantRegister);
                    }
                    break;

                case DynamicLoadKind::LocalWith:
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj_ReuseLoc, instLocation, recList.Item(i).instance);
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj_ReuseLoc, thisLocation, recList.Item(i).instance);
                    break;

                case DynamicLoadKind::EnvWith:
                {
                    Js::RegSlot tmpReg = funcInfo->AcquireTmpRegister();
                    this->m_writer.SlotI1(Js::OpCode::LdEnvObj, tmpReg, recList.Item(i).index);
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj_ReuseLoc, instLocation, tmpReg);
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj_ReuseLoc, thisLocation, tmpReg);
                    funcInfo->ReleaseTmpRegister(tmpReg);
                    break;
                }

                default:
                    AssertOrFailFast(UNREACHED);
            }

            if (i == recList.Count() - 1)
            {
                break;
            }
            this->m_writer.Br(doneLabel);
        }

        this->m_writer.MarkLabel(doneLabel);
    }

    *pThisLocation = thisLocation;
    *pInstLocation = instLocation;
}